

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

void decSetMaxValue(decNumber *dn,decContext *set)

{
  uint8_t *__s;
  int iVar1;
  
  iVar1 = set->digits;
  __s = dn->lsu;
  dn->digits = iVar1;
  if (1 < (long)iVar1) {
    memset(__s,9,(ulong)(iVar1 - 1));
    __s = dn->lsu + (long)iVar1 + -1;
    iVar1 = 1;
  }
  *__s = (char)DECPOWERS[iVar1] + 0xff;
  dn->bits = '\0';
  dn->exponent = (set->emax - set->digits) + 1;
  return;
}

Assistant:

static void decSetMaxValue(decNumber *dn, decContext *set) {
  Unit *up;                        /* work  */
  Int count=set->digits;           /* nines to add  */
  dn->digits=count;
  /* fill in all nines to set maximum value  */
  for (up=dn->lsu; ; up++) {
    if (count>DECDPUN) *up=DECDPUNMAX;  /* unit full o'nines  */
     else {                             /* this is the msu  */
      *up=(Unit)(powers[count]-1);
      break;
      }
    count-=DECDPUN;                /* filled those digits  */
    } /* up  */
  dn->bits=0;                      /* + sign  */
  dn->exponent=set->emax-set->digits+1;
  }